

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O0

void __thiscall OpenMD::IndexFinder::IndexFinder(IndexFinder *this,SimInfo *info)

{
  int iVar1;
  int iVar2;
  SimInfo *in_RSI;
  EVP_PKEY_CTX *ctx;
  IndexFinder *in_RDI;
  value_type_conflict1 *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *this_00;
  
  in_RDI->info_ = in_RSI;
  std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::vector
            ((vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)0x3b8fb0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3b8fce);
  SimInfo::getNGlobalAtoms(in_RDI->info_);
  SimInfo::getNGlobalRigidBodies(in_RDI->info_);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SimInfo::getNGlobalBonds(in_RDI->info_);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SimInfo::getNGlobalBends(in_RDI->info_);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SimInfo::getNGlobalTorsions(in_RDI->info_);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = &in_RDI->nObjects_;
  SimInfo::getNGlobalInversions(in_RDI->info_);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar1 = SimInfo::getNGlobalMolecules(in_RDI->info_);
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar2 = SimInfo::getNGlobalMolecules(in_RDI->info_);
  ctx = (EVP_PKEY_CTX *)(long)iVar2;
  std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::resize
            ((vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)this_00,
             CONCAT44(iVar1,in_stack_ffffffffffffff58));
  init(in_RDI,ctx);
  return;
}

Assistant:

IndexFinder::IndexFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    selectionSets_.resize(info_->getNGlobalMolecules());
    init();
  }